

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_destruct.cc
# Opt level: O0

void __thiscall re2c::Go::~Go(Go *this)

{
  SwitchIf *this_00;
  GoBitmap *this_01;
  Cpgoto *this_02;
  Dot *this_03;
  Go *this_local;
  
  switch(this->type) {
  case EMPTY:
    break;
  case SWITCH_IF:
    this_00 = (this->info).switchif;
    if (this_00 != (SwitchIf *)0x0) {
      SwitchIf::~SwitchIf(this_00);
      operator_delete(this_00,0x10);
    }
    break;
  case BITMAP:
    this_01 = (this->info).bitmap;
    if (this_01 != (GoBitmap *)0x0) {
      GoBitmap::~GoBitmap(this_01);
      operator_delete(this_01,0x20);
    }
    break;
  case CPGOTO:
    this_02 = (this->info).cpgoto;
    if (this_02 != (Cpgoto *)0x0) {
      Cpgoto::~Cpgoto(this_02);
      operator_delete(this_02,0x10);
    }
    break;
  case DOT:
    this_03 = (this->info).dot;
    if (this_03 != (Dot *)0x0) {
      Dot::~Dot(this_03);
      operator_delete(this_03,0x10);
    }
  }
  return;
}

Assistant:

Go::~Go ()
{
	switch (type)
	{
		case EMPTY:
			break;
		case SWITCH_IF:
			delete info.switchif;
			break;
		case BITMAP:
			delete info.bitmap;
			break;
		case CPGOTO:
			delete info.cpgoto;
			break;
		case DOT:
			delete info.dot;
			break;
	}
}